

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

void hedg::stream::authenticate_msg(streambuf *request,stream_authenticate *p)

{
  ostream *poVar1;
  ostream request_stream;
  ostream local_120 [8];
  ios_base local_118 [264];
  
  std::ostream::ostream(local_120,&request->super_streambuf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_120,"{\"op\":\"authentication\",\"id\":1,\"appKey\":\"",0x28);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_120,config::app_key_abi_cxx11_,DAT_001f88c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\",\"session\":\"",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(p->session_id)._M_dataplus._M_p,(p->session_id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"}",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_120,"\r\n",2);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void authenticate_msg(boost::asio::streambuf& request, params::stream_authenticate p) {
		std::ostream request_stream(&request);
		request_stream << "{\"op\":\"authentication\",\"id\":1,\"appKey\":\"" << config::app_key << "\","
			"\"session\":\"" << p.session_id << "\"}";
		request_stream << "\r\n";
	}